

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O1

void __thiscall
ValidationSignals::RegisterValidationInterface
          (ValidationSignals *this,CValidationInterface *callbacks)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<CValidationInterface> callbacks_00;
  element_type local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28._vptr_CValidationInterface = (_func_int **)callbacks;
  local_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_20->_M_use_count = 1;
  local_20->_M_weak_count = 1;
  local_20->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00b3a5d0;
  local_20[1]._vptr__Sp_counted_base = (_func_int **)callbacks;
  callbacks_00.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  callbacks_00.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_28;
  RegisterSharedValidationInterface(this,callbacks_00);
  if (local_20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::RegisterValidationInterface(CValidationInterface* callbacks)
{
    // Create a shared_ptr with a no-op deleter - CValidationInterface lifecycle
    // is managed by the caller.
    RegisterSharedValidationInterface({callbacks, [](CValidationInterface*){}});
}